

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

mz_zip_reader_extract_iter_state *
mz_zip_reader_extract_file_iter_new(mz_zip_archive *pZip,char *pFilename,mz_uint flags)

{
  mz_bool mVar1;
  mz_zip_reader_extract_iter_state *pmVar2;
  mz_uint32 file_index;
  mz_uint local_1c;
  
  pmVar2 = (mz_zip_reader_extract_iter_state *)0x0;
  mVar1 = mz_zip_reader_locate_file_v2(pZip,pFilename,(char *)0x0,flags,&local_1c);
  if (mVar1 != 0) {
    pmVar2 = mz_zip_reader_extract_iter_new(pZip,local_1c,flags);
  }
  return pmVar2;
}

Assistant:

mz_zip_reader_extract_iter_state* mz_zip_reader_extract_file_iter_new(mz_zip_archive *pZip, const char *pFilename, mz_uint flags)
{
    mz_uint32 file_index;

    /* Locate file index by name */
    if (!mz_zip_reader_locate_file_v2(pZip, pFilename, NULL, flags, &file_index))
        return NULL;

    /* Construct iterator */
    return mz_zip_reader_extract_iter_new(pZip, file_index, flags);
}